

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
Measurements::BenchmarkBase<Measurements::AllocCount>::run_poly_vec
          (BenchmarkBase<Measurements::AllocCount> *this)

{
  AllocCount *pAVar1;
  iterator iVar2;
  iterator iVar3;
  uint local_14;
  uint c;
  BenchmarkBase<Measurements::AllocCount> *this_local;
  
  for (local_14 = 0; local_14 < this->iteration_count; local_14 = local_14 + 1) {
    pAVar1 = derived(this);
    iVar2 = poly::
            vector<Interface,_Measurements::CountingAllocator<Interface>,_poly::delegate_cloning_policy<Interface,_Measurements::CountingAllocator<Interface>,_std::integral_constant<bool,_true>_>_>
            ::begin(&pAVar1->pv);
    pAVar1 = derived(this);
    iVar3 = poly::
            vector<Interface,_Measurements::CountingAllocator<Interface>,_poly::delegate_cloning_policy<Interface,_Measurements::CountingAllocator<Interface>,_std::integral_constant<bool,_true>_>_>
            ::end(&pAVar1->pv);
    std::
    for_each<poly::vector_iterator<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,Measurements::CountingAllocator<Interface>,std::integral_constant<bool,true>>,std::allocator_traits<Measurements::CountingAllocator<Interface>>>>,Measurements::BenchmarkBase<Measurements::AllocCount>::run_poly_vec()::_lambda(Interface&)_1_>
              (iVar2.curr,iVar3.curr);
  }
  return;
}

Assistant:

auto     run_poly_vec()
    {
        for (auto c = 0U; c < iteration_count; c++) {
            std::for_each(
                derived().pv.begin(), derived().pv.end(), [](Interface& i) { i.doYourThing(); });
        }
    }